

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

void linfdelnum(lindef *lin,objnum objn)

{
  ushort *puVar1;
  ushort uVar2;
  uint uVar3;
  objnum *poVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *__src;
  _func_void_lindef_ptr_objnum_objnum **pp_Var7;
  int iVar8;
  int iVar9;
  objnum *__dest;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  size_t __n;
  ulong local_a8;
  ulong local_a0;
  undefined1 *local_98;
  
  iVar9 = *(int *)&lin[2].linbuf;
  if ((iVar9 != 0) && (uVar3 = (iVar9 + -1 >> 10) + 1, uVar3 != 0)) {
    pp_Var7 = &lin[1].linrenp;
    local_a0 = (ulong)uVar3;
    local_98 = (undefined1 *)((long)&lin[1].linrenp + 4);
    do {
      poVar4 = (objnum *)mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var7);
      if (0 < iVar9) {
        iVar15 = 0x400;
        if (iVar9 < 0x400) {
          iVar15 = iVar9;
        }
        iVar10 = 0;
        lVar12 = 0;
        iVar8 = 0;
        __dest = poVar4;
        do {
          if (*__dest == objn) {
            local_a8 = 1;
            if (lVar12 + 1 < (long)iVar15) {
              local_a8 = (ulong)(uint)(iVar15 + iVar8);
              uVar5 = 4;
              uVar14 = 1;
              do {
                if (*(objnum *)((long)__dest + uVar5) != objn) {
                  memmove(__dest,(void *)((uVar5 & 0xffffffff) + (long)__dest),
                          (long)((iVar10 + iVar15 * 4) - (int)uVar5));
                  local_a8 = uVar14;
                  break;
                }
                uVar5 = uVar5 + 4;
                lVar11 = uVar14 + lVar12;
                uVar14 = uVar14 + 1;
              } while (lVar11 + 1 < (long)iVar15);
            }
            if (local_a0 == 1) {
              iVar15 = iVar15 - (int)local_a8;
            }
            else {
              puVar6 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)pp_Var7 + 2));
              memcpy((void *)((long)((iVar15 - (int)local_a8) * 4) + (long)poVar4),puVar6,
                     (ulong)(uint)((int)local_a8 * 4));
              mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)pp_Var7 + 2));
            }
            if (1 < local_a0) {
              lVar11 = 0;
              iVar13 = iVar9;
              do {
                iVar16 = 0x400;
                if (iVar13 < 0x400) {
                  iVar16 = iVar13;
                }
                puVar6 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_98 + lVar11 * 2 + -2));
                __n = (size_t)((iVar16 - (int)local_a8) * 4);
                memmove(puVar6,puVar6 + (uint)((int)local_a8 * 4),__n);
                if (lVar11 + 2U < local_a0) {
                  __src = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_98 + lVar11 * 2));
                  memcpy(puVar6 + __n,__src,(ulong)(uint)((int)local_a8 * 4));
                  mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_98 + lVar11 * 2));
                }
                uVar2 = *(ushort *)
                         (*(long *)(lin[1].linofsp +
                                   (ulong)(*(ushort *)(local_98 + lVar11 * 2 + -2) >> 8) * 8 + 0x30)
                         + (ulong)(*(ushort *)(local_98 + lVar11 * 2 + -2) & 0xff) * 2);
                puVar1 = (ushort *)
                         (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar2 >> 8) * 8) + 0x14 +
                         (ulong)((uVar2 & 0xff) << 5));
                *puVar1 = *puVar1 | 1;
                mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(local_98 + lVar11 * 2 + -2));
                iVar13 = iVar13 + -0x400;
                lVar11 = lVar11 + 1;
              } while (local_a0 - 1 != lVar11);
            }
            lin[2].linbuf = lin[2].linbuf + -(local_a8 & 0xffffffff);
          }
          lVar12 = lVar12 + 1;
          __dest = __dest + 2;
          iVar8 = iVar8 + -1;
          iVar10 = iVar10 + -4;
        } while (lVar12 < iVar15);
      }
      uVar2 = *(ushort *)
               (*(long *)(lin[1].linofsp + (ulong)(*(ushort *)pp_Var7 >> 8) * 8 + 0x30) +
               (ulong)(*(ushort *)pp_Var7 & 0xff) * 2);
      puVar1 = (ushort *)
               (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar2 >> 8) * 8) + 0x14 +
               (ulong)((uVar2 & 0xff) << 5));
      *puVar1 = *puVar1 | 1;
      mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var7);
      pp_Var7 = (_func_void_lindef_ptr_objnum_objnum **)((long)pp_Var7 + 2);
      local_a0 = local_a0 - 1;
      iVar9 = iVar9 + -0x400;
      local_98 = local_98 + 2;
    } while ((int)local_a0 != 0);
  }
  return;
}

Assistant:

void linfdelnum(lindef *lin, objnum objn)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    uchar  *objp_orig;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = objp_orig = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            int j;
            
            /* check this one */
            if (osrp2(objp) == objn)
            {
                uchar *nxtp;
                uint pg;
                int delcnt;
                int totrem;
                
                /* 
                 *   it matches - delete it, along with any subsequent
                 *   contiguous entries that also match it 
                 */
                for (delcnt = 1, j = i + 1 ; j < pgtot ; ++j, ++delcnt)
                {
                    /* 
                     *   if this one doesn't match, we've found the end of
                     *   the contiguous records for this object 
                     */
                    if (osrp2(objp + (j - i)*DBGLINFSIZ) != objn)
                        break;
                }

                /* close up the gap on this page */
                if (j < pgtot)
                    memmove(objp, objp + delcnt*DBGLINFSIZ,
                            (pgtot - j)*DBGLINFSIZ);

                /* 
                 *   if this isn't the last page, copy the bottom of the
                 *   next page to the gap at the top of this page 
                 */
                if (pgcnt > 1)
                {
                    /* lock the next page */
                    nxtp = mcmlck(linf->linfmem, *(pgobjn + 1));

                    /* 
                     *   copy from the beginning of the next page to the
                     *   end of this page 
                     */
                    memcpy(objp_orig + (pgtot - delcnt)*DBGLINFSIZ,
                           nxtp, delcnt*DBGLINFSIZ);

                    /* done with the page */
                    mcmunlck(linf->linfmem, *(pgobjn + 1));
                }
                else
                {
                    /* 
                     *   this is the last page, so there's no next page to
                     *   copy items from - reduce the count of items on
                     *   this page accordingly 
                     */
                    pgtot -= delcnt;
                }

                /*
                 *   Now rearrange all subsequent pages to accommodate the
                 *   gap we just created 
                 */
                for (totrem = tot, pg = 1 ; pg < pgcnt ;
                     totrem -= 1024, ++pg)
                {
                    uchar *curp;
                    int curtot;

                    /* figure how many we have on this page */
                    curtot = (totrem > 1024 ? 1024 : totrem);
                    
                    /* lock this page */
                    curp = mcmlck(linf->linfmem, *(pgobjn + pg));

                    /* delete from the start of this page */
                    memmove(curp, curp + delcnt*DBGLINFSIZ,
                            (curtot - delcnt)*DBGLINFSIZ);

                    /* if there's another page, copy from it */
                    if (pg + 1 < pgcnt)
                    {
                        /* lock the next page */
                        nxtp = mcmlck(linf->linfmem, *(pgobjn + pg + 1));

                        /* 
                         *   copy from the start of the next page to the
                         *   end of this page 
                         */
                        memcpy(curp + (curtot - delcnt)*DBGLINFSIZ,
                               nxtp, delcnt*DBGLINFSIZ);

                        /* unlock it */
                        mcmunlck(linf->linfmem, *(pgobjn + pg + 1));
                    }

                    /* done with the page - touch it and unlock it */
                    mcmtch(linf->linfmem, *(pgobjn + pg));
                    mcmunlck(linf->linfmem, *(pgobjn + pg));
                }

                /* deduct the removed records from the total */
                linf->linfcrec -= delcnt;
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}